

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_flash_attn_back(ggml_compute_params *params,bool masked,ggml_tensor *dst)

{
  ggml_type gVar1;
  ggml_tensor *pgVar2;
  ulong uVar3;
  ggml_tensor *pgVar4;
  int64_t iVar5;
  long lVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  int n;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  int64_t i;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  float *pfVar18;
  float *pfVar19;
  undefined7 in_register_00000031;
  undefined8 uVar20;
  int iVar21;
  ulong uVar22;
  ggml_compute_params *pgVar23;
  int iVar24;
  int64_t ic;
  ulong uVar25;
  ggml_tensor *pgVar26;
  long lVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float v;
  undefined8 extraout_XMM0_Qa;
  ggml_float gVar31;
  undefined1 extraout_var [56];
  int local_218;
  float local_200;
  float max;
  ggml_tensor *local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  int64_t local_1d0;
  int64_t local_1c8;
  ggml_tensor *local_1c0;
  int local_1b8;
  int local_1b4;
  uint local_1b0;
  undefined4 local_1ac;
  void *local_1a8;
  long local_1a0;
  long local_198;
  ggml_compute_params *local_190;
  ulong local_188;
  ulong local_180;
  long local_178;
  long local_170;
  ggml_tensor *local_168;
  ggml_tensor *local_160;
  float *local_158;
  size_t local_150;
  size_t local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  size_t local_120;
  size_t local_118;
  size_t local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  long local_f0;
  long local_e8;
  size_t local_e0;
  size_t local_d8;
  void *local_d0;
  long local_c8;
  ulong local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  size_t local_90;
  size_t local_88;
  ulong local_80;
  float *local_78;
  float *local_70;
  long local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  ulong local_48;
  size_t local_40;
  long local_38;
  undefined1 auVar32 [64];
  
  pgVar26 = dst->src[0];
  local_1ac = (undefined4)CONCAT71(in_register_00000031,masked);
  if (pgVar26->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1d05,"fatal error");
  }
  pgVar2 = dst->src[1];
  uVar16 = pgVar26->ne[0];
  uVar15 = pgVar26->ne[1];
  uVar3 = pgVar2->ne[1];
  n = (int)uVar3;
  local_1b0 = n + 3U & 0xfffffffc;
  uVar22 = (ulong)(int)local_1b0;
  uVar25 = uVar22;
  if ((long)uVar22 < (long)uVar16) {
    uVar25 = uVar16;
  }
  local_198 = uVar3 - uVar15;
  if (local_198 < 0) {
    pcVar14 = "P >= 0";
    uVar20 = 0x1bde;
  }
  else {
    local_1f8 = pgVar26;
    if (pgVar26->nb[0] == 4) {
      if (pgVar2->nb[0] == 4) {
        local_1c0 = dst->src[2];
        if (local_1c0->nb[0] == 4) {
          if (pgVar2->ne[0] == uVar16) {
            if (local_1c0->ne[1] == uVar16) {
              pgVar4 = dst->src[3];
              if (pgVar4->ne[0] == uVar16) {
                if (pgVar4->ne[1] == uVar15) {
                  if (dst->nb[0] == 4) {
                    if (dst->nb[1] < 4) {
                      pcVar14 = "nb0 <= nb1";
                      uVar20 = 0x1bf0;
                    }
                    else if (dst->nb[2] < dst->nb[1]) {
                      pcVar14 = "nb1 <= nb2";
                      uVar20 = 0x1bf1;
                    }
                    else {
                      local_1e8 = uVar25;
                      local_1e0 = uVar16;
                      local_80 = uVar22;
                      if (dst->nb[3] < dst->nb[2]) {
                        pcVar14 = "nb2 <= nb3";
                        uVar20 = 0x1bf2;
                      }
                      else {
                        iVar5 = pgVar2->ne[3];
                        iVar21 = params->ith;
                        local_88 = pgVar26->nb[1];
                        local_d8 = pgVar26->nb[2];
                        local_1c8 = pgVar26->ne[2];
                        local_40 = local_1c0->nb[1];
                        local_f8 = pgVar26->nb[3];
                        lVar6 = pgVar2->ne[2];
                        local_118 = local_1c0->nb[3];
                        local_148 = pgVar2->nb[1];
                        local_100 = pgVar2->nb[2];
                        local_1f0 = (ulong)(uint)params->nth;
                        local_108 = pgVar2->nb[3];
                        local_110 = local_1c0->nb[2];
                        local_1d0 = local_1c0->ne[0];
                        local_150 = pgVar4->nb[0];
                        local_90 = pgVar4->nb[1];
                        local_e0 = pgVar4->nb[2];
                        local_120 = pgVar4->nb[3];
                        local_168 = pgVar4;
                        if (iVar21 == 0) {
                          memset(dst->data,0,dst->ne[3] * dst->ne[2] * dst->ne[1] * dst->ne[0] * 4);
                        }
                        local_190 = params;
                        ggml_barrier(params->threadpool);
                        lVar11 = ggml_nelements(pgVar26);
                        local_160 = pgVar2;
                        lVar12 = ggml_nelements(pgVar2);
                        gVar1 = dst->type;
                        lVar13 = ggml_blck_size(gVar1);
                        if (lVar13 == 1) {
                          lVar13 = ggml_type_size(gVar1);
                          uVar16 = local_1e0;
                          auVar32._8_56_ = extraout_var;
                          auVar32._0_8_ = extraout_XMM0_Qa;
                          local_1a8 = dst->data;
                          local_218 = (int)lVar6;
                          iVar24 = (int)iVar5 * local_218;
                          local_1d8 = lVar12 * lVar13 + 0xfU & 0xfffffffffffffff0;
                          uVar25 = lVar11 * lVar13 + 0xfU & 0xfffffffffffffff0;
                          local_170 = local_1e0 * 4;
                          auVar29._0_4_ = (float)(long)local_1e0;
                          auVar29._4_12_ = auVar32._4_12_;
                          iVar9 = (iVar24 + -1 + (int)local_1f0) / (int)local_1f0;
                          local_1a0 = local_170 * uVar15;
                          iVar17 = iVar9 * iVar21;
                          iVar9 = iVar9 + iVar17;
                          if (iVar24 <= iVar9) {
                            iVar9 = iVar24;
                          }
                          if (auVar29._0_4_ < 0.0) {
                            fVar30 = sqrtf(auVar29._0_4_);
                          }
                          else {
                            auVar29 = vsqrtss_avx(auVar29,auVar29);
                            fVar30 = auVar29._0_4_;
                          }
                          local_128 = local_1a0 * local_1c8;
                          local_b0 = (long)n;
                          local_98 = local_1d0 * 4;
                          local_1d0 = local_1d0 * uVar16;
                          local_198 = local_198 + 1;
                          local_188 = ~((long)uVar16 >> 0x3f) & uVar16;
                          local_138 = uVar16 * uVar3;
                          local_48 = ~((long)uVar15 >> 0x3f) & uVar15;
                          local_a8 = (long)(int)local_1e8 + 0x10;
                          local_a0 = (iVar21 * 2) * local_a8;
                          local_f0 = (long)iVar9;
                          local_b8 = local_a0 * 4;
                          local_130 = (long)local_1a8 + uVar25;
                          local_1d8 = local_1d8 + uVar25 + (long)local_1a8;
                          uVar10 = (uint)(local_1c8 / lVar6);
                          local_c0 = (ulong)(~((int)uVar10 >> 0x1f) & uVar10);
                          pgVar23 = local_190;
                          pgVar26 = local_1f8;
                          local_1c8 = local_1c8 << 2;
                          for (local_e8 = (long)iVar17; local_e8 < local_f0; local_e8 = local_e8 + 1
                              ) {
                            local_1b8 = (int)(local_e8 / lVar6);
                            lVar11 = (long)local_1b8;
                            local_1b8 = local_1b8 * local_218;
                            local_140 = lVar11 * local_f8;
                            local_c8 = lVar11 * local_120;
                            local_d0 = (void *)(local_128 * lVar11 + (long)local_1a8);
                            local_1b4 = (int)local_e8 - local_1b8;
                            local_1b8 = (int)local_e8 - local_1b8;
                            lVar12 = (long)local_1b4;
                            local_68 = local_100 * lVar12 + lVar11 * local_108;
                            local_38 = lVar11 * local_108 + (long)local_1b8 * local_100;
                            local_60 = local_110 * lVar12 + lVar11 * local_118;
                            lVar11 = lVar11 * local_1c8 + lVar12 * 4;
                            local_78 = (float *)(local_138 * lVar11 + local_130);
                            local_70 = (float *)(lVar11 * local_1d0 + local_1d8);
                            for (local_50 = 0; local_50 != local_c0; local_50 = local_50 + 1) {
                              local_178 = (long)local_1b4 * local_e0 + local_c8;
                              lVar11 = (long)((int)local_50 * local_218 + local_1b8);
                              local_1f0 = local_d8 * lVar11;
                              local_58 = (void *)(lVar11 * local_1a0 + (long)local_d0);
                              for (local_180 = 0; lVar11 = local_b8, local_180 != local_48;
                                  local_180 = local_180 + 1) {
                                pvVar7 = pgVar23->wdata;
                                pfVar18 = (float *)((long)pvVar7 + local_a0 * 4);
                                for (lVar12 = local_b0; lVar12 < (long)local_80; lVar12 = lVar12 + 1
                                    ) {
                                  *(undefined4 *)((long)pvVar7 + lVar12 * 4 + local_b8) = 0xff800000
                                  ;
                                }
                                uVar16 = local_198 + local_180;
                                if ((char)local_1ac == '\0') {
                                  uVar16 = uVar3;
                                }
                                local_1e8 = local_180 * local_88;
                                lVar12 = 0;
                                uVar25 = ~((long)uVar16 >> 0x3f) & uVar16;
                                uVar15 = uVar25;
                                while (bVar28 = uVar15 != 0, uVar15 = uVar15 - 1, bVar28) {
                                  ggml_vec_dot_f32((int)local_1e0,
                                                   (float *)((lVar12 >> 0x1e) + (long)pfVar18),0,
                                                   (float *)((long)local_160->data +
                                                            local_38 + (lVar12 >> 0x20) * local_148)
                                                   ,0,(float *)((long)pgVar26->data +
                                                               local_140 + local_1f0 + local_1e8),0,
                                                   1);
                                  lVar12 = lVar12 + 0x100000000;
                                }
                                iVar21 = (int)uVar16;
                                ggml_vec_scale_f32(iVar21,pfVar18,1.0 / fVar30);
                                for (; (long)uVar16 < (long)uVar3; uVar16 = uVar16 + 1) {
                                  *(undefined4 *)((long)pvVar7 + uVar16 * 4 + lVar11) = 0xff800000;
                                }
                                max = -INFINITY;
                                pfVar19 = pfVar18 + local_a8;
                                ggml_vec_max_f32(iVar21,&max,pfVar18);
                                gVar31 = ggml_vec_soft_max_f32(local_1b0,pfVar19,pfVar18,max);
                                v = (float)(1.0 / gVar31);
                                local_158 = pfVar19;
                                ggml_vec_scale_f32(iVar21,pfVar19,v);
                                ggml_vec_set_f32(iVar21,pfVar18,v);
                                uVar16 = local_188;
                                lVar12 = local_60;
                                lVar13 = local_178;
                                while (pfVar19 = local_158, bVar28 = uVar16 != 0,
                                      uVar16 = uVar16 - 1, bVar28) {
                                  ggml_vec_mad_f32(iVar21,pfVar18,
                                                   (float *)((long)local_1c0->data + lVar12),
                                                   *(float *)((long)local_168->data + lVar13));
                                  lVar13 = lVar13 + local_150;
                                  lVar12 = lVar12 + local_40;
                                }
                                local_200 = 0.0;
                                ggml_vec_dot_f32(iVar21,&local_200,0,local_158,0,pfVar18,0,1);
                                auVar8._8_4_ = 0x80000000;
                                auVar8._0_8_ = 0x8000000080000000;
                                auVar8._12_4_ = 0x80000000;
                                auVar29 = vxorps_avx512vl(ZEXT416((uint)local_200),auVar8);
                                ggml_vec_acc1_f32(n,pfVar18,auVar29._0_4_);
                                ggml_vec_mul_f32(iVar21,pfVar18,pfVar18,pfVar19);
                                ggml_vec_scale_f32(iVar21,pfVar18,1.0 / fVar30);
                                pgVar26 = local_160;
                                pfVar18 = (float *)(local_180 * local_170 + (long)local_58);
                                lVar12 = local_68;
                                for (uVar16 = 0; pgVar2 = local_1f8, iVar9 = (int)local_1e0,
                                    uVar25 != uVar16; uVar16 = uVar16 + 1) {
                                  ggml_vec_mad_f32(iVar9,pfVar18,
                                                   (float *)((long)pgVar26->data + lVar12),
                                                   *(float *)((long)pvVar7 + uVar16 * 4 + lVar11));
                                  lVar12 = lVar12 + local_148;
                                }
                                pfVar18 = local_78;
                                for (uVar16 = 0; lVar13 = local_98, pgVar26 = local_168,
                                    lVar12 = local_178, uVar15 = local_188, pfVar19 = local_70,
                                    lVar27 = local_178, uVar25 != uVar16; uVar16 = uVar16 + 1) {
                                  ggml_vec_mad_f32(iVar9,pfVar18,
                                                   (float *)((long)pgVar2->data +
                                                            local_140 + local_1f0 + local_1e8),
                                                   *(float *)((long)pvVar7 + uVar16 * 4 + lVar11));
                                  pfVar18 = (float *)((long)pfVar18 + local_170);
                                }
                                while (uVar15 != 0) {
                                  ggml_vec_mad_f32(iVar21,pfVar19,local_158,
                                                   *(float *)((long)pgVar26->data + lVar27));
                                  uVar15 = uVar15 - 1;
                                  pfVar19 = (float *)((long)pfVar19 + lVar13);
                                  lVar27 = lVar27 + local_150;
                                }
                                local_178 = lVar12 + local_90;
                                pgVar23 = local_190;
                                pgVar26 = local_1f8;
                              }
                              local_1b4 = local_1b4 + local_218;
                            }
                          }
                          return;
                        }
                        pcVar14 = "ggml_blck_size(result_type) == 1";
                        uVar20 = 0x1bfd;
                      }
                    }
                  }
                  else {
                    pcVar14 = "nb0 == sizeof(float)";
                    uVar20 = 0x1bef;
                  }
                }
                else {
                  pcVar14 = "ned1 == N";
                  uVar20 = 0x1bec;
                }
              }
              else {
                pcVar14 = "ned0 == D";
                uVar20 = 0x1be7;
              }
            }
            else {
              pcVar14 = "nev1 == D";
              uVar20 = 0x1be6;
            }
          }
          else {
            pcVar14 = "nek0 == D";
            uVar20 = 0x1be5;
          }
        }
        else {
          pcVar14 = "nbv0 == sizeof(float)";
          uVar20 = 0x1be2;
        }
      }
      else {
        pcVar14 = "nbk0 == sizeof(float)";
        uVar20 = 0x1be1;
      }
    }
    else {
      pcVar14 = "nbq0 == sizeof(float)";
      uVar20 = 0x1be0;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar20,"GGML_ASSERT(%s) failed",pcVar14);
}

Assistant:

void ggml_compute_forward_flash_attn_back(
        const ggml_compute_params * params,
        const bool masked,
        ggml_tensor * dst) {

    const ggml_tensor * q = dst->src[0];

    switch (q->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_flash_attn_back_f32(params, masked, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}